

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file.cpp
# Opt level: O1

void __thiscall cppcms::http::file::output_file(file *this,string *name,bool is_temporary)

{
  int iVar1;
  runtime_error *this_00;
  uint uVar2;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  impl::file_buffer::name(&((this->d).ptr_)->fb,name);
  uVar2 = 6;
  if ((int)CONCAT71(in_register_00000011,is_temporary) == 0) {
    iVar1 = impl::file_buffer::to_file(&((this->d).ptr_)->fb);
    uVar2 = 2;
    if (iVar1 != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::operator+(&bStack_38,"Failed to write to file ",name);
      booster::runtime_error::runtime_error(this_00,&bStack_38);
      *(undefined ***)this_00 = &PTR__runtime_error_00287810;
      (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00287838;
      __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  *(uint *)&this->field_0x440 = *(uint *)&this->field_0x440 & 0xfffffff9 | uVar2;
  return;
}

Assistant:

void file::output_file(std::string const &name,bool is_temporary)
{
	d->fb.name(name);
	if(!is_temporary) {
		if(d->fb.to_file()!=0) {
			throw cppcms_error("Failed to write to file " + name);
		}
	}
	file_specified_ = 1;
	file_temporary_ = is_temporary ? 1:0;

}